

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_ops.cc
# Opt level: O0

bool google::protobuf::internal::ReflectionOps::IsInitialized(Message *message)

{
  undefined4 uVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  CppType CVar5;
  uint uVar6;
  FieldDescriptor *field_00;
  FieldDescriptor *pFVar7;
  Descriptor *this;
  MapFieldBase *pMVar8;
  int j;
  int size;
  MapIterator end;
  MapIterator iter;
  MapFieldBase *map_field;
  FieldDescriptor *value_field;
  FieldDescriptor *field;
  int i_1;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  int i;
  Reflection *reflection;
  Descriptor *descriptor;
  MapIterator *in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffea0;
  int in_stack_fffffffffffffea4;
  FieldDescriptor *in_stack_fffffffffffffea8;
  undefined7 in_stack_fffffffffffffeb0;
  undefined1 in_stack_fffffffffffffeb7;
  Reflection *in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffec0;
  undefined2 in_stack_fffffffffffffec4;
  undefined1 in_stack_fffffffffffffec7;
  Reflection *in_stack_fffffffffffffec8;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  Message *in_stack_ffffffffffffff08;
  Reflection *this_00;
  Reflection *in_stack_ffffffffffffff18;
  int local_d4;
  int in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff34;
  undefined1 local_c8 [8];
  Message *in_stack_ffffffffffffff40;
  undefined1 local_98 [8];
  MapFieldBase *in_stack_ffffffffffffff70;
  KeyValue in_stack_ffffffffffffff78;
  MapIterator *in_stack_ffffffffffffff80;
  int local_50;
  undefined1 local_40 [40];
  Descriptor *local_18;
  byte local_1;
  
  local_18 = Message::GetDescriptor
                       ((Message *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
  local_40._32_8_ = GetReflectionOrDie(in_stack_ffffffffffffff40);
  for (local_40._28_4_ = 0; uVar1 = local_40._28_4_, iVar4 = Descriptor::field_count(local_18),
      (int)uVar1 < iVar4; local_40._28_4_ = local_40._28_4_ + 1) {
    Descriptor::field(local_18,local_40._28_4_);
    bVar2 = FieldDescriptor::is_required((FieldDescriptor *)0x704e4c);
    if (bVar2) {
      in_stack_ffffffffffffff18 = (Reflection *)local_40._32_8_;
      Descriptor::field(local_18,local_40._28_4_);
      bVar2 = Reflection::HasField
                        (in_stack_fffffffffffffeb8,
                         (Message *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0),
                         in_stack_fffffffffffffea8);
      if (!bVar2) {
        local_1 = 0;
        goto LAB_00705374;
      }
    }
  }
  this_00 = (Reflection *)local_40;
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            *)0x704edb);
  Reflection::ListFields
            (this_00,in_stack_ffffffffffffff08,
             (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
  local_50 = 0;
  do {
    field_00 = (FieldDescriptor *)(long)local_50;
    pFVar7 = (FieldDescriptor *)
             std::
             vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ::size((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     *)local_40);
    if (pFVar7 <= field_00) {
      local_1 = 1;
LAB_00705356:
      std::
      vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ::~vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0));
LAB_00705374:
      return (bool)(local_1 & 1);
    }
    std::
    vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::operator[]((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  *)local_40,(long)local_50);
    CVar5 = FieldDescriptor::cpp_type((FieldDescriptor *)0x704f5a);
    if (CVar5 == CPPTYPE_MESSAGE) {
      bVar2 = FieldDescriptor::is_map
                        ((FieldDescriptor *)
                         CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
      if (bVar2) {
        this = FieldDescriptor::message_type
                         ((FieldDescriptor *)
                          CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
        Descriptor::field(this,1);
        CVar5 = FieldDescriptor::cpp_type((FieldDescriptor *)0x704fd1);
        if (CVar5 == CPPTYPE_MESSAGE) {
          pMVar8 = Reflection::GetMapData
                             ((Reflection *)
                              CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0),
                              (Message *)in_stack_fffffffffffffea8,
                              (FieldDescriptor *)
                              CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
          bVar2 = MapFieldBase::IsMapValid
                            ((MapFieldBase *)
                             CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
          if (!bVar2) goto LAB_007051e8;
          MapIterator::MapIterator
                    (in_stack_ffffffffffffff80,(Message *)in_stack_ffffffffffffff78.string_value_,
                     (FieldDescriptor *)in_stack_ffffffffffffff70);
          MapIterator::MapIterator
                    (in_stack_ffffffffffffff80,(Message *)in_stack_ffffffffffffff78.string_value_,
                     (FieldDescriptor *)in_stack_ffffffffffffff70);
          (*pMVar8->_vptr_MapFieldBase[6])(pMVar8,local_98);
          (*pMVar8->_vptr_MapFieldBase[7])(pMVar8,local_c8);
          while (bVar2 = protobuf::operator!=
                                   ((MapIterator *)
                                    CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                                    in_stack_fffffffffffffe98), bVar2) {
            MapIterator::GetValueRef((MapIterator *)local_98);
            in_stack_fffffffffffffec8 =
                 (Reflection *)
                 MapValueRef::GetMessageValue
                           ((MapValueRef *)
                            CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
            uVar6 = (*((MessageLite *)&in_stack_fffffffffffffec8->descriptor_)->_vptr_MessageLite[8]
                    )();
            in_stack_fffffffffffffec7 = (undefined1)uVar6;
            if ((uVar6 & 1) == 0) {
              local_1 = 0;
              in_stack_ffffffffffffff34 = 1;
              goto LAB_0070519e;
            }
            MapIterator::operator++
                      ((MapIterator *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0))
            ;
          }
          in_stack_ffffffffffffff34 = 7;
LAB_0070519e:
          MapIterator::~MapIterator
                    ((MapIterator *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
          MapIterator::~MapIterator
                    ((MapIterator *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
          if (in_stack_ffffffffffffff34 != 7) goto LAB_00705356;
        }
      }
      else {
LAB_007051e8:
        bVar2 = FieldDescriptor::is_repeated((FieldDescriptor *)0x7051f5);
        if (bVar2) {
          in_stack_fffffffffffffec0 =
               Reflection::FieldSize(in_stack_ffffffffffffff18,(Message *)this_00,field_00);
          in_stack_ffffffffffffff30 = in_stack_fffffffffffffec0;
          for (local_d4 = 0; local_d4 < in_stack_ffffffffffffff30; local_d4 = local_d4 + 1) {
            in_stack_fffffffffffffeb8 =
                 (Reflection *)
                 Reflection::GetRepeatedMessage
                           (in_stack_fffffffffffffeb8,
                            (Message *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0)
                            ,in_stack_fffffffffffffea8,in_stack_fffffffffffffea4);
            uVar6 = (*((MessageLite *)&in_stack_fffffffffffffeb8->descriptor_)->_vptr_MessageLite[8]
                    )();
            in_stack_fffffffffffffeb7 = (undefined1)uVar6;
            if ((uVar6 & 1) == 0) {
              local_1 = 0;
              goto LAB_00705356;
            }
          }
        }
        else {
          in_stack_fffffffffffffea8 =
               (FieldDescriptor *)
               Reflection::GetMessage
                         (in_stack_fffffffffffffec8,
                          (Message *)
                          CONCAT17(in_stack_fffffffffffffec7,
                                   CONCAT16(bVar2,CONCAT24(in_stack_fffffffffffffec4,
                                                           in_stack_fffffffffffffec0))),
                          (FieldDescriptor *)in_stack_fffffffffffffeb8,
                          (MessageFactory *)
                          CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0));
          bVar3 = (**(code **)((long)*(MessageLite *)in_stack_fffffffffffffea8 + 0x40))();
          in_stack_fffffffffffffea4 = CONCAT13(bVar3,(int3)in_stack_fffffffffffffea4);
          if ((bVar3 & 1) == 0) {
            local_1 = 0;
            goto LAB_00705356;
          }
        }
      }
    }
    local_50 = local_50 + 1;
  } while( true );
}

Assistant:

bool ReflectionOps::IsInitialized(const Message& message) {
  const Descriptor* descriptor = message.GetDescriptor();
  const Reflection* reflection = GetReflectionOrDie(message);

  // Check required fields of this message.
  for (int i = 0; i < descriptor->field_count(); i++) {
    if (descriptor->field(i)->is_required()) {
      if (!reflection->HasField(message, descriptor->field(i))) {
        return false;
      }
    }
  }

  // Check that sub-messages are initialized.
  std::vector<const FieldDescriptor*> fields;
  reflection->ListFields(message, &fields);
  for (int i = 0; i < fields.size(); i++) {
    const FieldDescriptor* field = fields[i];
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {

      if (field->is_map()) {
        const FieldDescriptor* value_field = field->message_type()->field(1);
        if (value_field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
          const MapFieldBase* map_field =
              reflection->GetMapData(message, field);
          if (map_field->IsMapValid()) {
            MapIterator iter(const_cast<Message*>(&message), field);
            MapIterator end(const_cast<Message*>(&message), field);
            for (map_field->MapBegin(&iter), map_field->MapEnd(&end);
                 iter != end; ++iter) {
              if (!iter.GetValueRef().GetMessageValue().IsInitialized()) {
                return false;
              }
            }
            continue;
          }
        } else {
          continue;
        }
      }

      if (field->is_repeated()) {
        int size = reflection->FieldSize(message, field);

        for (int j = 0; j < size; j++) {
          if (!reflection->GetRepeatedMessage(message, field, j)
                   .IsInitialized()) {
            return false;
          }
        }
      } else {
        if (!reflection->GetMessage(message, field).IsInitialized()) {
          return false;
        }
      }
    }
  }

  return true;
}